

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp
# Opt level: O0

void __thiscall
glcts::InvalidTextureSizesAreRejectedValidAreAcceptedTest::initInternals
          (InvalidTextureSizesAreRejectedValidAreAcceptedTest *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  InvalidTextureSizesAreRejectedValidAreAcceptedTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6f8))(1,&this->to_id_2d_array_1);
  (**(code **)(lVar3 + 0x6f8))(1,&this->to_id_2d_array_2);
  (**(code **)(lVar3 + 0x6f8))(1,&this->to_id_2d_array_3);
  (**(code **)(lVar3 + 0x868))(0xd33,&this->max_texture_size);
  (**(code **)(lVar3 + 0x868))(0x88ff,&this->max_array_texture_layers);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"Texture objects creation failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                  ,0xab);
  return;
}

Assistant:

void InvalidTextureSizesAreRejectedValidAreAcceptedTest::initInternals()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate first texture object. */
	gl.genTextures(1, &to_id_2d_array_1);

	/* Generate second texture object. */
	gl.genTextures(1, &to_id_2d_array_2);

	/* Generate third texture object. */
	gl.genTextures(1, &to_id_2d_array_3);

	/* Retrieve maximum 3D texture image dimensions. */
	gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &max_texture_size);
	gl.getIntegerv(GL_MAX_ARRAY_TEXTURE_LAYERS, &max_array_texture_layers);

	/* Make sure no error was generated. */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture objects creation failed.");
}